

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

double __thiscall Console::log(Console *this,double __x)

{
  const_iterator __position;
  tm *ptVar1;
  ostream *poVar2;
  double extraout_XMM0_Qa;
  _Put_time<char> __f;
  time_t date_c;
  Log entry;
  string local_1b8 [32];
  ostringstream stream;
  
  entry.formatted_date._M_dataplus._M_p = (pointer)&entry.formatted_date.field_2;
  entry.date.__d.__r = (duration)0;
  entry.formatted_date._M_string_length = 0;
  entry.formatted_date.field_2._M_local_buf[0] = '\0';
  entry.message._M_dataplus._M_p = (pointer)&entry.message.field_2;
  entry.message._M_string_length = 0;
  entry.message.field_2._M_local_buf[0] = '\0';
  entry.date.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::__cxx11::string::_M_assign((string *)&entry.message);
  date_c = (long)entry.date.__d.__r / 1000000000;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  ptVar1 = localtime(&date_c);
  __f._M_fmt = "%H:%M:%S";
  __f._M_tmb = (tm *)ptVar1;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&stream,__f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&entry.formatted_date,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[1;34m[");
  poVar2 = std::operator<<(poVar2,(string *)&entry.formatted_date);
  poVar2 = std::operator<<(poVar2,"]\x1b[0m ");
  poVar2 = std::operator<<(poVar2,(string *)&entry.message);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::vector<Log,_std::allocator<Log>_>::push_back(&this->history,&entry);
  __position._M_current =
       (this->history).super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data
       ._M_start;
  if ((ulong)(long)this->history_size <
      (ulong)(((long)(this->history).super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__position._M_current) / 0x48)) {
    std::vector<Log,_std::allocator<Log>_>::erase(&this->history,__position);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  Log::~Log(&entry);
  return extraout_XMM0_Qa;
}

Assistant:

void Console::log(std::string message) {
    Log entry;
    entry.date = std::chrono::system_clock::now();
    entry.message = message;
    
    std::time_t date_c = std::chrono::system_clock::to_time_t(entry.date);
    
    std::ostringstream stream;
    stream << std::put_time(std::localtime(&date_c), "%H:%M:%S");
    
    entry.formatted_date = stream.str();

    std::cout << "\033[1;34m[" << entry.formatted_date << "]\033[0m " << entry.message << std::endl;
    
    history.push_back(entry);
    
    if (history.size() > history_size) {
        history.erase(history.begin());
    }
}